

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

void __thiscall cmNinjaNormalTargetGenerator::Generate(cmNinjaNormalTargetGenerator *this)

{
  TargetType TVar1;
  ulong uVar2;
  char *m2;
  cmGeneratorTarget *pcVar3;
  cmNinjaNormalTargetGenerator *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    WriteLanguagesRules(this);
    cmNinjaTargetGenerator::WriteObjectBuildStatements(&this->super_cmNinjaTargetGenerator);
    pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    TVar1 = cmGeneratorTarget::GetType(pcVar3);
    if (TVar1 == OBJECT_LIBRARY) {
      WriteObjectLibStatement(this);
    }
    else {
      WriteLinkStatement(this);
    }
  }
  else {
    pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    cmGeneratorTarget::GetName_abi_cxx11_(pcVar3);
    m2 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Error
              ("CMake can not determine linker language for target: ",m2,(char *)0x0,(char *)0x0);
  }
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::Generate()
{
  if (this->TargetLinkLanguage.empty()) {
    cmSystemTools::Error("CMake can not determine linker language for "
                         "target: ",
                         this->GetGeneratorTarget()->GetName().c_str());
    return;
  }

  // Write the rules for each language.
  this->WriteLanguagesRules();

  // Write the build statements
  this->WriteObjectBuildStatements();

  if(this->GetGeneratorTarget()->GetType() == cmState::OBJECT_LIBRARY)
    {
    this->WriteObjectLibStatement();
    }
  else
    {
    this->WriteLinkStatement();
    }
}